

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>,8ul>>
::
emplace_new_key<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>
          (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
          *key)

{
  undefined1 uVar1;
  NamedParamAssignmentSyntax *pNVar2;
  size_t sVar3;
  char *pcVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined7 uVar7;
  sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>,8ul>>
  sVar8;
  long lVar9;
  EntryPointer psVar10;
  undefined1 uVar11;
  NamedParamAssignmentSyntax *pNVar12;
  EntryPointer psVar13;
  char cVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>,_bool>
  pVar17;
  basic_string_view<char,_std::char_traits<char>_> __tmp_1;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
  local_48;
  size_t local_28;
  char *pcStack_20;
  
  if ((*(long *)(this + 0x10) != 0) &&
     (this[0x19] !=
      (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>,8ul>>
       )distance_from_desired)) {
    psVar10 = (EntryPointer)(*(long *)(this + 0x20) + 1);
    auVar15._8_4_ = (int)((ulong)psVar10 >> 0x20);
    auVar15._0_8_ = psVar10;
    auVar15._12_4_ = 0x45300000;
    lVar9 = *(long *)(this + 0x10) + 1;
    auVar16._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar16._0_8_ = lVar9;
    auVar16._12_4_ = 0x45300000;
    if ((auVar15._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)psVar10) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x1c) *
        ((auVar16._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0))) {
      cVar14 = current_entry->distance_from_desired;
      if (cVar14 < '\0') {
        sVar3 = (key->first)._M_len;
        pcVar4 = (key->first)._M_str;
        bVar6 = (key->second).second;
        uVar7 = *(undefined7 *)&(key->second).field_0x9;
        (current_entry->field_1).value.second.first = (key->second).first;
        *(bool *)((long)&current_entry->field_1 + 0x18) = bVar6;
        *(undefined7 *)((long)&current_entry->field_1 + 0x19) = uVar7;
        (current_entry->field_1).value.first._M_len = sVar3;
        (current_entry->field_1).value.first._M_str = pcVar4;
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        sVar3 = (key->first)._M_len;
        pcVar4 = (key->first)._M_str;
        pNVar2 = (key->second).first;
        uVar5 = *(undefined8 *)&(key->second).second;
        current_entry->distance_from_desired = distance_from_desired;
        local_48.first._M_len = (current_entry->field_1).value.first._M_len;
        local_48.first._M_str = (current_entry->field_1).value.first._M_str;
        (current_entry->field_1).value.first._M_len = sVar3;
        (current_entry->field_1).value.first._M_str = pcVar4;
        pNVar12 = (current_entry->field_1).value.second.first;
        (current_entry->field_1).value.second.first = pNVar2;
        local_48.second.second = SUB81(uVar5,0);
        uVar11 = *(undefined1 *)((long)&current_entry->field_1 + 0x18);
        *(bool *)((long)&current_entry->field_1 + 0x18) = local_48.second.second;
        sVar8 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>,8ul>>
                 )(cVar14 + '\x01');
        psVar10 = current_entry + 1;
        cVar14 = current_entry[1].distance_from_desired;
        local_48.second._9_7_ = SUB87((ulong)uVar5 >> 8,0);
        psVar13 = current_entry;
        if (-1 < cVar14) {
          do {
            psVar13 = psVar10;
            if (cVar14 < (char)sVar8) {
              psVar13->distance_from_desired = (int8_t)sVar8;
              sVar3 = (psVar13->field_1).value.first._M_len;
              pcVar4 = (psVar13->field_1).value.first._M_str;
              (psVar13->field_1).value.first._M_len = local_48.first._M_len;
              (psVar13->field_1).value.first._M_str = local_48.first._M_str;
              pNVar2 = (psVar13->field_1).value.second.first;
              (psVar13->field_1).value.second.first = pNVar12;
              uVar1 = *(undefined1 *)((long)&psVar13->field_1 + 0x18);
              *(undefined1 *)((long)&psVar13->field_1 + 0x18) = uVar11;
              sVar8 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>,8ul>>
                       )(cVar14 + '\x01');
              pNVar12 = pNVar2;
              uVar11 = uVar1;
              local_48.first._M_len = sVar3;
              local_48.first._M_str = pcVar4;
            }
            else {
              sVar8 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>,8ul>>
                       )((char)sVar8 + '\x01');
              if (sVar8 == this[0x19]) {
                local_28 = local_48.first._M_len;
                pcStack_20 = local_48.first._M_str;
                sVar3 = (current_entry->field_1).value.first._M_len;
                pcVar4 = (current_entry->field_1).value.first._M_str;
                (current_entry->field_1).value.first._M_len = local_48.first._M_len;
                (current_entry->field_1).value.first._M_str = local_48.first._M_str;
                local_48.second.first = (current_entry->field_1).value.second.first;
                (current_entry->field_1).value.second.first = pNVar12;
                local_48.second.second = *(bool *)((long)&current_entry->field_1 + 0x18);
                *(undefined1 *)((long)&current_entry->field_1 + 0x18) = uVar11;
                key = &local_48;
                local_48.first._M_len = sVar3;
                local_48.first._M_str = pcVar4;
                goto LAB_001d1cd7;
              }
            }
            cVar14 = psVar13[1].distance_from_desired;
            psVar10 = psVar13 + 1;
          } while (-1 < cVar14);
        }
        psVar13[1].field_1.value.first._M_len = local_48.first._M_len;
        psVar13[1].field_1.value.first._M_str = local_48.first._M_str;
        psVar13[1].field_1.value.second.first = pNVar12;
        *(undefined1 *)((long)&psVar13[1].field_1 + 0x18) = uVar11;
        local_48.second._9_4_ = SUB84((ulong)uVar5 >> 8,0);
        *(undefined4 *)((long)&psVar13[1].field_1 + 0x19) = local_48.second._9_4_;
        local_48.second._13_2_ = SUB82((ulong)uVar5 >> 0x28,0);
        *(undefined2 *)((long)&psVar13[1].field_1 + 0x1d) = local_48.second._13_2_;
        local_48.second._15_1_ = SUB81((ulong)uVar5 >> 0x38,0);
        *(undefined1 *)((long)&psVar13[1].field_1 + 0x1f) = local_48.second._15_1_;
        psVar10->distance_from_desired = (int8_t)sVar8;
      }
      *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
      pVar17._9_7_ = (int7)((ulong)psVar10 >> 8);
      pVar17.second = true;
      pVar17.first.current = current_entry;
      return pVar17;
    }
  }
LAB_001d1cd7:
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>,_8UL>_>
  ::grow((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>_>,_8UL>_>
          *)this);
  pVar17 = emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>>
                     (this,key);
  return pVar17;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }